

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_46ee::aligned_allocator_test_test_multiple_allocations_Test::
~aligned_allocator_test_test_multiple_allocations_Test
          (aligned_allocator_test_test_multiple_allocations_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(aligned_allocator_test, test_multiple_allocations)
{
    constexpr vector_r16b::size_type NUM_ENTRIES = 16;
    vector_r16b values;

    auto rounds = NUM_ENTRIES;
    while (rounds-- > 0)
        values.push_back(vector_r16b::value_type(rounds));

    EXPECT_EQ(values.size(), NUM_ENTRIES);
}